

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

IndexPair __thiscall
slang::IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u>::
modifyRoot<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>,slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>,false>
          (IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u> *this,
          BranchNode<unsigned_long,_8U,_true> *rootNode,uint32_t position,allocator_type *alloc)

{
  unsigned_long *puVar1;
  interval<unsigned_long> *piVar2;
  uint uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  bool bVar6;
  BranchNode<unsigned_long,_8U,_false> *pBVar7;
  long lVar8;
  ulong *puVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint *puVar13;
  ulong uVar14;
  long lVar15;
  uint *puVar16;
  int iVar17;
  bool bVar18;
  uint32_t sizes [2];
  uint32_t local_68;
  uint local_64;
  ulong local_60 [3];
  IndexPair local_48;
  IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u> *local_40;
  allocator_type *local_38;
  
  puVar16 = &local_68;
  puVar13 = &local_68;
  local_40 = this;
  local_38 = alloc;
  local_48 = IntervalMapDetails::distribute(2,*(uint32_t *)(this + 0xc4),8,&local_68,position);
  uVar11 = 0;
  puVar9 = local_60 + 1;
  local_60[1] = 0;
  local_60[0] = 0;
  bVar6 = true;
  do {
    bVar18 = bVar6;
    pBVar7 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)local_38);
    uVar3 = *puVar16;
    iVar17 = (int)uVar11;
    if (uVar3 != 0) {
      lVar8 = 0x20;
      uVar10 = uVar3;
      do {
        *(uintptr_t *)
         ((long)((pBVar7->
                 super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                 ).first + -4) + lVar8) =
             (rootNode->
             super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
             ).first[uVar11].pip.value;
        piVar2 = (rootNode->
                 super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                 ).second + uVar11;
        uVar5 = piVar2->right;
        puVar1 = (unsigned_long *)
                 ((long)&(pBVar7->
                         super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                         ).first[0].pip.value + lVar8 * 2);
        *puVar1 = piVar2->left;
        puVar1[1] = uVar5;
        uVar11 = (ulong)((int)uVar11 + 1);
        lVar8 = lVar8 + 8;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    uVar11 = (ulong)(iVar17 + uVar3);
    *puVar9 = (ulong)pBVar7 & 0xffffffffffffffc0 | (ulong)(uVar3 - 1);
    puVar9 = local_60;
    puVar16 = &local_64;
    bVar6 = false;
  } while (bVar18);
  lVar8 = 0;
  puVar9 = local_60 + 1;
  bVar6 = true;
  do {
    bVar18 = bVar6;
    uVar11 = *puVar9;
    uVar12 = uVar11 & 0xffffffffffffffc0;
    uVar14 = *(ulong *)(uVar12 + 0x48);
    if (1 < (ulong)*puVar13) {
      lVar15 = 0;
      do {
        uVar4 = *(ulong *)(uVar12 + 0x58 + lVar15);
        if (uVar14 <= uVar4) {
          uVar14 = uVar4;
        }
        lVar15 = lVar15 + 0x10;
      } while ((ulong)*puVar13 * 0x10 + -0x10 != lVar15);
    }
    *(undefined8 *)(local_40 + lVar8 * 0x10 + 0x40) = *(undefined8 *)(uVar12 + 0x40);
    *(ulong *)(local_40 + lVar8 * 0x10 + 0x48) = uVar14;
    *(ulong *)(local_40 + lVar8 * 8) = uVar11;
    lVar8 = 1;
    puVar13 = &local_64;
    puVar9 = local_60;
    bVar6 = false;
  } while (bVar18);
  *(undefined4 *)(local_40 + 0xc4) = 2;
  *(int *)(local_40 + 0xc0) = *(int *)(local_40 + 0xc0) + 1;
  return local_48;
}

Assistant:

IntervalMapDetails::IndexPair IntervalMap<TKey, TValue, N>::modifyRoot(TRootNode& rootNode,
                                                                       uint32_t position,
                                                                       allocator_type& alloc) {
    using namespace IntervalMapDetails;

    // Split the root branch node into two new nodes.
    constexpr uint32_t NumNodes = 2;
    uint32_t sizes[NumNodes];
    IndexPair newOffset = distribute(NumNodes, rootSize, Leaf::Capacity, sizes, position);

    // Construct new nodes.
    uint32_t pos = 0;
    NodeRef nodes[NumNodes];
    for (uint32_t i = 0; i < NumNodes; i++) {
        auto newNode = alloc.template emplace<TNewNode>();
        uint32_t size = sizes[i];

        newNode->copy(rootNode, pos, 0, size);
        nodes[i] = NodeRef(newNode, size);
        pos += size;
    }

    if (SwitchToBranch) {
        // Destroy the old root leaf and switch it to a branch node.
        rootLeaf.~RootLeaf();
        new (&rootBranch) RootBranch();
    }

    for (uint32_t i = 0; i < NumNodes; i++) {
        rootBranch.keyAt(i) = nodes[i].template get<TNewNode>().getBounds(sizes[i]);
        rootBranch.childAt(i) = nodes[i];
    }

    rootSize = NumNodes;
    height++;
    return newOffset;
}